

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::SimdLoadLaneExpr::SimdLoadLaneExpr
          (SimdLoadLaneExpr *this,Opcode opcode,Var *memidx,Address align,Address offset,
          uint64_t val,Location *loc)

{
  Var local_80;
  uint64_t local_38;
  uint64_t val_local;
  Address offset_local;
  Address align_local;
  Var *memidx_local;
  SimdLoadLaneExpr *this_local;
  Opcode opcode_local;
  
  local_38 = val;
  val_local = offset;
  offset_local = align;
  align_local = (Address)memidx;
  memidx_local = (Var *)this;
  this_local._4_4_ = opcode.enum_;
  Var::Var(&local_80,memidx);
  MemoryExpr<(wabt::ExprType)44>::MemoryExpr
            (&this->super_MemoryExpr<(wabt::ExprType)44>,&local_80,loc);
  Var::~Var(&local_80);
  (this->super_MemoryExpr<(wabt::ExprType)44>).super_ExprMixin<(wabt::ExprType)44>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__SimdLoadLaneExpr_002d3260;
  (this->opcode).enum_ = this_local._4_4_;
  this->align = offset_local;
  this->offset = val_local;
  this->val = local_38;
  return;
}

Assistant:

SimdLoadLaneExpr(Opcode opcode,
                   Var memidx,
                   Address align,
                   Address offset,
                   uint64_t val,
                   const Location& loc = Location())
      : MemoryExpr<ExprType::SimdLoadLane>(memidx, loc),
        opcode(opcode),
        align(align),
        offset(offset),
        val(val) {}